

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_> *
__thiscall
CMU462::StaticScene::Mesh::get_primitives
          (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
           *__return_storage_ptr__,Mesh *this)

{
  pointer puVar1;
  Triangle *in_RAX;
  ulong uVar2;
  Triangle *this_00;
  long lVar3;
  bool bVar4;
  Triangle *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (ulong)((long)(this->indices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->indices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) / 3;
  lVar3 = 0x10;
  local_38 = in_RAX;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    this_00 = (Triangle *)operator_new(0x40);
    puVar1 = (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    Triangle::Triangle(this_00,this,*(size_t *)((long)puVar1 + lVar3 + -0x10),
                       *(size_t *)((long)puVar1 + lVar3 + -8),*(size_t *)((long)puVar1 + lVar3));
    local_38 = this_00;
    std::vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>::
    emplace_back<CMU462::StaticScene::Primitive*>
              ((vector<CMU462::StaticScene::Primitive*,std::allocator<CMU462::StaticScene::Primitive*>>
                *)__return_storage_ptr__,(Primitive **)&local_38);
    lVar3 = lVar3 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Primitive*> Mesh::get_primitives() const {

  vector<Primitive*> primitives;
  size_t num_triangles = indices.size() / 3;
  for (size_t i = 0; i < num_triangles; ++i) {
    Triangle* tri = new Triangle(this, indices[i * 3],
                                       indices[i * 3 + 1],
                                       indices[i * 3 + 2]);
    primitives.push_back(tri);
  }
  return primitives;
}